

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_Test::testBody
          (TEST_MockCheckedActualCall_remainderOfMockActualCallTraceWorksAsItShould_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  long lVar8;
  unsigned_long uVar9;
  cpputest_longlong cVar10;
  cpputest_ulonglong cVar11;
  void *pvVar12;
  _func_void *p_Var13;
  MockActualCallTrace actual;
  SimpleString expectedString;
  int const_value;
  int value;
  uchar mem_buffer [2];
  MockNamedValue local_d8;
  double local_88;
  SimpleString local_80;
  MockNamedValue local_70;
  
  const_value = 1;
  mem_buffer[0] = 0xfe;
  mem_buffer[1] = '\x15';
  MockActualCallTrace::MockActualCallTrace(&actual);
  SimpleString::SimpleString((SimpleString *)&local_d8,"func");
  MockActualCallTrace::withName(&actual,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  MockActualCallTrace::withCallOrder(&actual,1);
  MockActualCallTrace::onObject(&actual,&value);
  SimpleString::SimpleString((SimpleString *)&local_d8,"bool");
  MockActualCallTrace::withBoolParameter(&actual,(SimpleString *)&local_d8,true);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"unsigned_int");
  MockActualCallTrace::withUnsignedIntParameter(&actual,(SimpleString *)&local_d8,1);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"unsigned_long");
  MockActualCallTrace::withUnsignedLongIntParameter(&actual,(SimpleString *)&local_d8,1);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"long_int");
  MockActualCallTrace::withLongIntParameter(&actual,(SimpleString *)&local_d8,1);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"long_long_int");
  MockActualCallTrace::withLongLongIntParameter(&actual,(SimpleString *)&local_d8,1);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"unsigned_long_long_int");
  MockActualCallTrace::withUnsignedLongLongIntParameter(&actual,(SimpleString *)&local_d8,1);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"pointer");
  MockActualCallTrace::withPointerParameter(&actual,(SimpleString *)&local_d8,&value);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"const_pointer");
  MockActualCallTrace::withConstPointerParameter(&actual,(SimpleString *)&local_d8,&const_value);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"function_pointer");
  MockActualCallTrace::withFunctionPointerParameter
            (&actual,(SimpleString *)&local_d8,(_func_void *)0xdead);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"mem_buffer");
  MockActualCallTrace::withMemoryBufferParameter(&actual,(SimpleString *)&local_d8,mem_buffer,2);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString((SimpleString *)&local_d8,"int");
  SimpleString::SimpleString((SimpleString *)&local_70,"named_type");
  MockActualCallTrace::withParameterOfType
            (&actual,(SimpleString *)&local_d8,(SimpleString *)&local_70,&const_value);
  SimpleString::~SimpleString((SimpleString *)&local_70);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::SimpleString(&expectedString,"\nFunction name:func");
  SimpleString::operator+=(&expectedString," withCallOrder:1");
  SimpleString::operator+=(&expectedString," onObject:0x");
  HexStringFrom(&local_d8);
  SimpleString::operator+=(&expectedString,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::operator+=(&expectedString," bool:true");
  SimpleString::operator+=(&expectedString," unsigned_int:1 (0x1)");
  SimpleString::operator+=(&expectedString," unsigned_long:1 (0x1)");
  SimpleString::operator+=(&expectedString," long_int:1 (0x1)");
  SimpleString::operator+=(&expectedString," long_long_int:1 (0x1)");
  SimpleString::operator+=(&expectedString," unsigned_long_long_int:1 (0x1)");
  SimpleString::operator+=(&expectedString," pointer:0x");
  HexStringFrom(&local_d8);
  SimpleString::operator+=(&expectedString,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::operator+=(&expectedString," const_pointer:0x");
  HexStringFrom(&local_d8);
  SimpleString::operator+=(&expectedString,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::operator+=(&expectedString," function_pointer:0x");
  HexStringFrom((_func_void *)&local_d8);
  SimpleString::operator+=(&expectedString,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  SimpleString::operator+=(&expectedString," mem_buffer:Size = 2 | HexContents = FE 15");
  SimpleString::operator+=(&expectedString," int named_type:0x");
  HexStringFrom(&local_d8);
  SimpleString::operator+=(&expectedString,(SimpleString *)&local_d8);
  SimpleString::~SimpleString((SimpleString *)&local_d8);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = SimpleString::asCharString(&expectedString);
  pcVar6 = MockActualCallTrace::getTraceOutput(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,pcVar5,pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xe9,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::hasReturnValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK_FALSE","actual.hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xeb,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  MockActualCallTrace::returnValue(&local_d8,&actual);
  SimpleString::SimpleString(&local_80,"");
  MockNamedValue::MockNamedValue(&local_70,&local_80);
  bVar1 = MockNamedValue::equals(&local_d8,&local_70);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)bVar1,"CHECK","actual.returnValue().equals(MockNamedValue(\"\"))",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xec,pTVar7);
  MockNamedValue::~MockNamedValue(&local_70);
  SimpleString::~SimpleString(&local_80);
  MockNamedValue::~MockNamedValue(&local_d8);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::returnBoolValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK","false == actual.returnBoolValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xed,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  bVar1 = MockActualCallTrace::returnBoolValueOrDefault(&actual,true);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)!bVar1,"CHECK","false == actual.returnBoolValueOrDefault(true)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xee,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xef,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar9 = MockActualCallTrace::returnUnsignedLongIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar9 == 0),"CHECK","0 == actual.returnUnsignedLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf0,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = MockActualCallTrace::returnIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(iVar2 == 0),"CHECK","0 == actual.returnIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf1,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar9 = MockActualCallTrace::returnUnsignedLongIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar9 == 0),"CHECK",
             "0 == actual.returnUnsignedLongIntValueOrDefault(1ul)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf2,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = MockActualCallTrace::returnIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(iVar2 == 0),"CHECK","0 == actual.returnIntValueOrDefault(1)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf3,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf4,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  lVar8 = MockActualCallTrace::returnLongIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(lVar8 == 0),"CHECK","0 == actual.returnLongIntValueOrDefault(1l)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf5,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar10 = MockActualCallTrace::returnLongLongIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar10 == 0),"CHECK","0 == actual.returnLongLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf7,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar10 = MockActualCallTrace::returnLongLongIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar10 == 0),"CHECK","0 == actual.returnLongLongIntValueOrDefault(1ll)",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf8,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar11 = MockActualCallTrace::returnUnsignedLongLongIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar11 == 0),"CHECK","0 == actual.returnUnsignedLongLongIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xf9,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  cVar11 = MockActualCallTrace::returnUnsignedLongLongIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(cVar11 == 0),"CHECK",
             "0 == actual.returnUnsignedLongLongIntValueOrDefault(1ull)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfa,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar3 = MockActualCallTrace::returnUnsignedIntValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 == 0),"CHECK","0 == actual.returnUnsignedIntValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfc,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  uVar3 = MockActualCallTrace::returnUnsignedIntValueOrDefault(&actual,1);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 == 0),"CHECK","0 == actual.returnUnsignedIntValueOrDefault(1u)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfd,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  local_88 = MockActualCallTrace::returnDoubleValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (0,local_88,0,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xfe,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  local_88 = MockActualCallTrace::returnDoubleValueOrDefault(&actual,1.0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (0,local_88,0,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0xff,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = MockActualCallTrace::returnStringValueOrDefault(&actual,"bla");
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x100,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pcVar5 = MockActualCallTrace::returnStringValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,"",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x101,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnPointerValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK","NULLPTR == actual.returnPointerValue()"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x102,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnPointerValueOrDefault(&actual,(void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnPointerValueOrDefault((void*) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x103,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnConstPointerValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnConstPointerValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x104,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  pvVar12 = MockActualCallTrace::returnConstPointerValueOrDefault(&actual,(void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(pvVar12 == (void *)0x0),"CHECK",
             "NULLPTR == actual.returnConstPointerValueOrDefault((const void*) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x105,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  p_Var13 = MockActualCallTrace::returnFunctionPointerValue(&actual);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(p_Var13 == (_func_void *)0x0),"CHECK",
             "NULLPTR == actual.returnFunctionPointerValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x106,pTVar7);
  pUVar4 = UtestShell::getCurrent();
  p_Var13 = MockActualCallTrace::returnFunctionPointerValueOrDefault(&actual,(_func_void *)0x0);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(p_Var13 == (_func_void *)0x0),"CHECK",
             "NULLPTR == actual.returnFunctionPointerValueOrDefault((void (*)()) NULLPTR)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x107,pTVar7);
  SimpleString::~SimpleString(&expectedString);
  MockActualCallTrace::~MockActualCallTrace(&actual);
  return;
}

Assistant:

TEST(MockCheckedActualCall, remainderOfMockActualCallTraceWorksAsItShould)
{
    int value;
    const int const_value = 1;
    const unsigned char mem_buffer[] = { 0xFE, 0x15 };
    void (*function_value)() = (void (*)())0xDEAD;
    MockActualCallTrace actual;
    actual.withName("func");
    actual.withCallOrder(1);
    actual.onObject(&value);

    actual.withBoolParameter("bool", true);
    actual.withUnsignedIntParameter("unsigned_int", (unsigned int) 1);
    actual.withUnsignedLongIntParameter("unsigned_long", (unsigned long)1);
    actual.withLongIntParameter("long_int", (long int) 1);
#if CPPUTEST_USE_LONG_LONG
    actual.withLongLongIntParameter("long_long_int", (long long int) 1);
    actual.withUnsignedLongLongIntParameter("unsigned_long_long_int", (unsigned long long int) 1);
#endif
    actual.withPointerParameter("pointer", &value);
    actual.withConstPointerParameter("const_pointer", &const_value);
    actual.withFunctionPointerParameter("function_pointer", function_value);
    actual.withMemoryBufferParameter("mem_buffer", mem_buffer, sizeof(mem_buffer));
    actual.withParameterOfType("int", "named_type", &const_value);

    SimpleString expectedString("\nFunction name:func");
    expectedString += " withCallOrder:1";
    expectedString += " onObject:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " bool:true";
    expectedString += " unsigned_int:1 (0x1)";
    expectedString += " unsigned_long:1 (0x1)";
    expectedString += " long_int:1 (0x1)";
#if CPPUTEST_USE_LONG_LONG
    expectedString += " long_long_int:1 (0x1)";
    expectedString += " unsigned_long_long_int:1 (0x1)";
#endif
    expectedString += " pointer:0x";
    expectedString += HexStringFrom(&value);
    expectedString += " const_pointer:0x";
    expectedString += HexStringFrom(&const_value);
    expectedString += " function_pointer:0x";
    expectedString += HexStringFrom(function_value);
    expectedString += " mem_buffer:Size = 2 | HexContents = FE 15";
    expectedString += " int named_type:0x";
    expectedString += HexStringFrom(&const_value);
    STRCMP_EQUAL(expectedString.asCharString(), actual.getTraceOutput());

    CHECK_FALSE(actual.hasReturnValue());
    CHECK(actual.returnValue().equals(MockNamedValue("")));
    CHECK(false == actual.returnBoolValue());
    CHECK(false == actual.returnBoolValueOrDefault(true));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValue());
    CHECK(0 == actual.returnIntValue());
    CHECK(0 == actual.returnUnsignedLongIntValueOrDefault(1ul));
    CHECK(0 == actual.returnIntValueOrDefault(1));
    CHECK(0 == actual.returnLongIntValue());
    CHECK(0 == actual.returnLongIntValueOrDefault(1l));
#if CPPUTEST_USE_LONG_LONG
    CHECK(0 == actual.returnLongLongIntValue());
    CHECK(0 == actual.returnLongLongIntValueOrDefault(1ll));
    CHECK(0 == actual.returnUnsignedLongLongIntValue());
    CHECK(0 == actual.returnUnsignedLongLongIntValueOrDefault(1ull));
#endif
    CHECK(0 == actual.returnUnsignedIntValue());
    CHECK(0 == actual.returnUnsignedIntValueOrDefault(1u));
    DOUBLES_EQUAL(0.0, actual.returnDoubleValue(), 0.0);
    DOUBLES_EQUAL(0.0, actual.returnDoubleValueOrDefault(1.0), 0.0);
    STRCMP_EQUAL("", actual.returnStringValueOrDefault("bla"));
    STRCMP_EQUAL("", actual.returnStringValue());
    CHECK(NULLPTR == actual.returnPointerValue());
    CHECK(NULLPTR == actual.returnPointerValueOrDefault((void*) NULLPTR));
    CHECK(NULLPTR == actual.returnConstPointerValue());
    CHECK(NULLPTR == actual.returnConstPointerValueOrDefault((const void*) NULLPTR));
    CHECK(NULLPTR == actual.returnFunctionPointerValue());
    CHECK(NULLPTR == actual.returnFunctionPointerValueOrDefault((void (*)()) NULLPTR));
}